

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

CoinsCacheSizeState __thiscall
Chainstate::GetCoinsCacheSizeState
          (Chainstate *this,size_t max_coins_cache_size_bytes,size_t max_mempool_size_bytes)

{
  string_view source_file;
  string_view logging_function;
  size_t sVar1;
  long *plVar2;
  char *pcVar3;
  CTxMemPool *in_RDX;
  LogFlags in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int64_t large_threshold;
  int64_t nMempoolUsage;
  int64_t nTotalSpace;
  int64_t cacheSize;
  Level in_stack_000000d0;
  long *in_stack_000000e0;
  long *in_stack_000000e8;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  long *in_stack_ffffffffffffff30;
  CCoinsViewCache *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  Chainstate *in_stack_ffffffffffffff48;
  undefined8 local_a0;
  LogFlags flag;
  long lVar4;
  int source_line;
  undefined4 local_5c;
  ConstevalFormatString<2U> fmt;
  char *pcVar5;
  
  pcVar5 = *(char **)(in_FS_OFFSET + 0x28);
  lVar4 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff2c,(AnnotatedMixin<std::recursive_mutex> *)0x14928f4);
  source_line = (int)((ulong)lVar4 >> 0x20);
  if (*(long *)(in_RDI + 0x28) == 0) {
    local_a0 = 0;
  }
  else {
    local_a0 = CTxMemPool::DynamicMemoryUsage(in_RDX);
  }
  CoinsTip(in_stack_ffffffffffffff48);
  sVar1 = CCoinsViewCache::DynamicMemoryUsage(in_stack_ffffffffffffff38);
  local_a0 = (long)in_RDX - local_a0;
  fmt.fmt = (char *)0x0;
  flag = in_RSI;
  plVar2 = std::max<long>(in_stack_ffffffffffffff30,
                          (long *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  pcVar3 = (char *)(in_RSI + *plVar2);
  plVar2 = std::max<long>(in_stack_ffffffffffffff30,
                          (long *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if ((long)pcVar3 < (long)sVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff40);
    logging_function._M_str = pcVar5;
    logging_function._M_len = sVar1;
    source_file._M_str = pcVar3;
    source_file._M_len = local_a0;
    LogPrintFormatInternal<long,long>
              (logging_function,source_file,source_line,flag,in_stack_000000d0,fmt,in_stack_000000e0
               ,in_stack_000000e8);
    local_5c = CRITICAL;
  }
  else if (*plVar2 < (long)sVar1) {
    local_5c = LARGE;
  }
  else {
    local_5c = OK;
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar5) {
    return local_5c;
  }
  __stack_chk_fail();
}

Assistant:

CoinsCacheSizeState Chainstate::GetCoinsCacheSizeState(
    size_t max_coins_cache_size_bytes,
    size_t max_mempool_size_bytes)
{
    AssertLockHeld(::cs_main);
    const int64_t nMempoolUsage = m_mempool ? m_mempool->DynamicMemoryUsage() : 0;
    int64_t cacheSize = CoinsTip().DynamicMemoryUsage();
    int64_t nTotalSpace =
        max_coins_cache_size_bytes + std::max<int64_t>(int64_t(max_mempool_size_bytes) - nMempoolUsage, 0);

    //! No need to periodic flush if at least this much space still available.
    static constexpr int64_t MAX_BLOCK_COINSDB_USAGE_BYTES = 10 * 1024 * 1024;  // 10MB
    int64_t large_threshold =
        std::max((9 * nTotalSpace) / 10, nTotalSpace - MAX_BLOCK_COINSDB_USAGE_BYTES);

    if (cacheSize > nTotalSpace) {
        LogPrintf("Cache size (%s) exceeds total space (%s)\n", cacheSize, nTotalSpace);
        return CoinsCacheSizeState::CRITICAL;
    } else if (cacheSize > large_threshold) {
        return CoinsCacheSizeState::LARGE;
    }
    return CoinsCacheSizeState::OK;
}